

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testRunStarting(ConsoleReporter *this,TestRunInfo *_testInfo)

{
  TestRunInfo *_testInfo_local;
  ConsoleReporter *this_local;
  
  StreamingReporterBase<Catch::ConsoleReporter>::testRunStarting
            (&this->super_StreamingReporterBase<Catch::ConsoleReporter>,_testInfo);
  printTestFilters(this);
  return;
}

Assistant:

void ConsoleReporter::testRunStarting(TestRunInfo const& _testInfo) {
    StreamingReporterBase::testRunStarting(_testInfo);
    printTestFilters();
}